

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void captureMouse(bool _enable)

{
  undefined7 in_register_00000039;
  
  mouse_capture_enabled = _enable;
  if ((int)CONCAT71(in_register_00000039,_enable) != 0) {
    mouseinterval(0);
    mousemask(0x10000003,0);
    return;
  }
  return;
}

Assistant:

void captureMouse(bool _enable) {
    #if defined(SUPPORT_NCURSES)
    mouse_capture_enabled = _enable;
    if (_enable) {
        mouseinterval(0);
        mousemask(BUTTON1_PRESSED | BUTTON1_RELEASED | REPORT_MOUSE_POSITION, nullptr);
        // printf("\033[?1003h\n"); // send mouse events

        // MEVENT mouse_event;
        // mouse_event.x = 0;
        // mouse_event.y = 0;
        // mouse_event.bstate = REPORT_MOUSE_POSITION;
        // ungetmouse(&mouse_event);

    }
    else {
        // printf("\033[?1003l\n"); // not send mouse events
    }
    #endif
}